

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
CHECK_BELLMAN_FORD(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *G,int *s,
                  WeightMap *weight,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                  vector<long,_std::allocator<long>_> *dist)

{
  unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *puVar1;
  int iVar2;
  type tVar3;
  pointer puVar4;
  pointer piVar5;
  unsigned_long uVar6;
  pointer psVar7;
  type *ptVar8;
  pointer plVar9;
  long lVar10;
  long *plVar11;
  long *plVar12;
  bool bVar13;
  vector<long,_std::allocator<long>_> *pvVar14;
  EdgeProperties *p;
  __normal_iterator<const_boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>
  _Var15;
  EdgeProperties *pEVar16;
  undefined8 uVar17;
  long lVar18;
  unsigned_long uVar19;
  type extraout_RDX;
  type extraout_RDX_00;
  type extraout_RDX_01;
  type tVar20;
  EdgeProperties *pEVar21;
  EdgeProperties *pEVar22;
  unsigned_long uVar23;
  type __args;
  type *ptVar24;
  ulong uVar25;
  long lVar26;
  AdjList *cg;
  size_type __n;
  AdjList *cg_1;
  vector<bool,_std::allocator<bool>_> reachable;
  EdgeIterator ei;
  EdgeIterator ei_end;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_1a8;
  vector<bool,_std::allocator<bool>_> local_110;
  _Head_base<0UL,_EdgeProperties_*,_false> local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 uStack_d8;
  undefined7 uStack_d7;
  byte bStack_d0;
  long *local_c8;
  unsigned_long local_c0;
  long *local_b8;
  unsigned_long local_b0;
  long local_a8;
  vector<long,_std::allocator<long>_> *local_a0;
  unsigned_long local_98;
  int *local_90;
  undefined8 local_88;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  undefined8 uStack_77;
  long *local_68;
  _Head_base<0UL,_EdgeProperties_*,_false> *local_40;
  undefined8 *local_38;
  
  __n = (long)(G->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(G->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_1a8.first.vBegin.m_value._0_4_ = 4;
  local_a0 = dist;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict3 *)&local_1a8,
             (allocator_type *)&local_e8);
  local_1a8.first.vBegin.m_value = local_1a8.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_110,__n,(bool *)&local_1a8,(allocator_type *)&local_e8);
  dfs(G,s,&local_110);
  tVar3 = (type)(G->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  tVar20 = (type)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  pEVar21 = (EdgeProperties *)((long)tVar20 - (long)tVar3 >> 5);
  if (tVar20 != tVar3) {
    puVar4 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pEVar16 = (EdgeProperties *)0x0;
    do {
      if (pEVar16 != (EdgeProperties *)(long)*s) {
        pEVar22 = (EdgeProperties *)((long)&pEVar16[0xf].weight + 3);
        if (-1 < (long)pEVar16) {
          pEVar22 = pEVar16;
        }
        uVar25 = 1L << ((byte)pEVar16 & 0x3f) &
                 local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)pEVar22 >> 6) +
                  ((ulong)(((ulong)pEVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)];
        if ((pEVar16 == (EdgeProperties *)puVar4[(long)pEVar16]) == (uVar25 != 0)) {
          __assert_fail("(pred[*v] == *v) == (reachable[*v] == false)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0x8b,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        if (uVar25 == 0) {
          piVar5[(long)pEVar16] = 1;
        }
      }
      pEVar16 = (EdgeProperties *)((long)&pEVar16->weight + 1);
    } while (pEVar21 != pEVar16);
  }
  pEVar16 = (EdgeProperties *)(long)*s;
  __args = (type)(pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (((_Head_base<0UL,_EdgeProperties_*,_false> *)((long)__args + (long)pEVar16 * 8))->_M_head_impl
      == pEVar16) {
    __args = (type)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    *(undefined4 *)((long)__args + (long)pEVar16 * 4) = 0;
  }
  if (tVar20 != tVar3) {
    pEVar16 = (EdgeProperties *)0x0;
    do {
      if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[(long)pEVar16] == 4) {
        local_1a8.first.m_g =
             (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
              *)0x0;
        local_1a8.second.vBegin.m_value = 0;
        local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_.aligner_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_._8_8_ = (type)0x0;
        local_1a8.first.vEnd.m_value = 0;
        local_1a8.first.edges.super_type._0_8_ = 0;
        local_1a8.first.vBegin.m_value = 0;
        local_1a8.first.vCurr.m_value = 0;
        __args = (type)0x0;
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,0);
        local_e8._M_head_impl = pEVar16;
        while( true ) {
          piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = piVar5[(long)local_e8._M_head_impl];
          if (iVar2 != 4) break;
          piVar5[(long)local_e8._M_head_impl] = 3;
          if ((property_ptr *)local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
              &local_1a8.first.m_g[-1].m_property) {
            __args = (type)&local_e8;
            std::deque<unsigned_long,std::allocator<unsigned_long>>::
            _M_push_back_aux<unsigned_long_const&>
                      ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_1a8,
                       (unsigned_long *)__args);
          }
          else {
            *(EdgeProperties **)local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                 local_e8._M_head_impl;
            local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                 local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + 8;
          }
          local_e8._M_head_impl =
               (EdgeProperties *)
               (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)local_e8._M_head_impl];
        }
        if (iVar2 == 3) {
          do {
            uVar17 = local_1a8.first.edges.super_type.m_storage.dummy_._16_8_;
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_) {
              uVar17 = *(long *)(local_1a8.second.vBegin.m_value - 8) + 0x200;
            }
            pEVar22 = (((unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                       (uVar17 + -8))->_M_t).
                      super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>
                      .super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl;
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_) {
              __args = (type)0x200;
              operator_delete((void *)local_1a8.first.edges.super_type.m_storage.dummy_._24_8_,0x200
                             );
              local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ =
                   *(type *)(local_1a8.second.vBegin.m_value - 8);
              local_1a8.first.m_g =
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x200);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x1f8;
              local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
            }
            else {
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
            }
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)pEVar22] = 2;
          } while (pEVar22 != local_e8._M_head_impl);
          while (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ !=
                 local_1a8.first.vEnd.m_value) {
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_) {
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [*(long *)(*(long *)(local_1a8.second.vBegin.m_value - 8) + 0x1f8)] = -1;
              __args = (type)0x200;
              operator_delete((void *)local_1a8.first.edges.super_type.m_storage.dummy_._24_8_,0x200
                             );
              local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ =
                   *(type *)(local_1a8.second.vBegin.m_value - 8);
              local_1a8.first.m_g =
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x200);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x1f8;
              local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
            }
            else {
              puVar1 = (unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                       (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(long)(puVar1->_M_t).
                     super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
                     super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl] = -1;
            }
          }
        }
        else {
          if (iVar2 == 2) {
            iVar2 = -1;
          }
          while (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ !=
                 local_1a8.first.vEnd.m_value) {
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_) {
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [*(long *)(*(long *)(local_1a8.second.vBegin.m_value - 8) + 0x1f8)] = iVar2;
              __args = (type)0x200;
              operator_delete((void *)local_1a8.first.edges.super_type.m_storage.dummy_._24_8_,0x200
                             );
              local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ =
                   *(type *)(local_1a8.second.vBegin.m_value - 8);
              local_1a8.first.m_g =
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x200);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x1f8;
              local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
            }
            else {
              puVar1 = (unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                       (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(long)(puVar1->_M_t).
                     super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
                     super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl] = iVar2;
            }
          }
        }
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8);
        tVar20 = extraout_RDX;
      }
      pEVar16 = (EdgeProperties *)((long)&pEVar16->weight + 1);
    } while (pEVar16 != pEVar21);
  }
  lVar18 = (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    uVar19 = lVar18 >> 5;
    uVar23 = 0;
    local_98 = uVar19;
    local_90 = s;
    do {
      if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar23] == 2) {
        lVar18 = 0;
        uVar19 = uVar23;
        do {
          uVar6 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar19];
          psVar7 = (G->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1a8.first.vBegin.m_value = uVar19;
          local_1a8.first.vCurr.m_value = (value_type)operator_new(4);
          *(undefined4 *)local_1a8.first.vCurr.m_value = 0;
          __args = *(type *)((long)&psVar7[uVar6].super_StoredVertex.m_out_edges.
                                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                            + 8);
          _Var15 = std::
                   __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                             (*(undefined8 *)
                               &psVar7[uVar6].super_StoredVertex.m_out_edges.
                                super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                              ,__args,&local_1a8);
          tVar20 = extraout_RDX_00;
          if ((undefined4 *)local_1a8.first.vCurr.m_value != (undefined4 *)0x0) {
            __args = (type)0x4;
            operator_delete((void *)local_1a8.first.vCurr.m_value,4);
            tVar20 = extraout_RDX_01;
          }
          lVar18 = lVar18 + *(int *)((long)&(((_Var15._M_current)->m_property)._M_t.
                                             super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>
                                             .super__Head_base<0UL,_EdgeProperties_*,_false>.
                                            _M_head_impl)->weight + weight->tag);
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar19] = -2;
          uVar19 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start[uVar19];
        } while (uVar19 != uVar23);
        uVar19 = local_98;
        s = local_90;
        if (-1 < lVar18) {
          __assert_fail("cycle_length < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xbc,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar19);
  }
  pvVar14 = local_a0;
  uVar17 = local_1a8.first.edges.super_type._0_8_;
  if (((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[*s] == 0) &&
     ((local_a0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[*s] != 0)) {
    __assert_fail("dist[s] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                  ,0xc0,
                  "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                 );
  }
  uStack_d8 = 0;
  uStack_d7 = 0;
  bStack_d0 = 0;
  local_e8._M_head_impl = (EdgeProperties *)0x0;
  uStack_e0 = 0;
  uStack_df = 0;
  uStack_78 = 0;
  uStack_77 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_7f = 0;
  ptVar24 = (type *)(G->super_type).m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  ptVar8 = (type *)(G->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8.first.vEnd.m_value = (long)ptVar8 - (long)ptVar24 >> 5;
  if (ptVar8 == ptVar24) {
    local_1a8.first.vCurr.m_value = 0;
    bVar13 = false;
  }
  else {
    tVar20 = *ptVar24;
    __args = ptVar24[1];
    if (__args == tVar20) {
      ptVar24 = ptVar24 + 5;
      local_1a8.first.vCurr.m_value = 0;
      do {
        if (local_1a8.first.vEnd.m_value + -1 == local_1a8.first.vCurr.m_value) {
          bVar13 = false;
          local_1a8.first.vCurr.m_value = local_1a8.first.vEnd.m_value;
          goto LAB_0011342b;
        }
        tVar20 = (type)((_Vector_impl_data *)(ptVar24 + -1))->_M_start;
        __args = *ptVar24;
        ptVar24 = ptVar24 + 4;
        local_1a8.first.vCurr.m_value = local_1a8.first.vCurr.m_value + 1;
      } while (__args == tVar20);
    }
    else {
      local_1a8.first.vCurr.m_value = 0;
    }
    bVar13 = true;
  }
LAB_0011342b:
  local_1a8.first.vBegin.m_value = 0;
  local_1a8.first.edges.super_type._0_8_ =
       local_1a8.first.edges.super_type._0_8_ & 0xffffffffffffff00;
  if (bVar13) {
    local_1a8.first.edges.super_type._1_7_ = SUB87(uVar17,1);
    local_1a8.first.edges.super_type.m_initialized = true;
    local_1a8.first.edges.super_type.m_storage.dummy_.aligner_ = tVar20;
    local_1a8.first.edges.super_type.m_storage.dummy_._8_8_ = local_1a8.first.vCurr.m_value;
    local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = __args;
    local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = local_1a8.first.vCurr.m_value;
  }
  local_1a8.second.vBegin.m_value = 0;
  local_1a8.second.edges.super_type.m_initialized = false;
  local_40 = &local_e8;
  local_38 = &local_88;
  local_1a8.first.m_g = G;
  local_1a8.second.vCurr.m_value = local_1a8.first.vEnd.m_value;
  local_1a8.second.vEnd.m_value = local_1a8.first.vEnd.m_value;
  local_1a8.second.m_g = G;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_1a8);
  if (local_1a8.second.edges.super_type.m_initialized == true) {
    local_1a8.second.edges.super_type.m_initialized = false;
  }
  if (local_1a8.first.edges.super_type.m_initialized == true) {
    local_1a8.first.edges.super_type._0_8_ =
         local_1a8.first.edges.super_type._0_8_ & 0xffffffffffffff00;
  }
  uVar19 = CONCAT71(uStack_d7,uStack_d8);
  piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar9 = (pvVar14->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = CONCAT71(uStack_df,uStack_e0);
LAB_0011353b:
  do {
    if (uVar23 == CONCAT71(uStack_7f,uStack_80)) {
      if (uVar23 == uVar19) {
LAB_00113639:
        if (uStack_77._7_1_ == '\x01') {
          uStack_77 = uStack_77 & 0xffffffffffffff;
        }
        if (bStack_d0 == 1) {
          bStack_d0 = 0;
        }
        if (local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        return __return_storage_ptr__;
      }
      if (((bStack_d0 & 1) == 0) || ((uStack_77 & 0x100000000000000) == 0)) goto LAB_001136bb;
      if (local_c8 == local_68) goto LAB_00113639;
    }
    if ((bStack_d0 & 1) == 0) {
LAB_001136bb:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    lVar18 = *local_c8;
    if (piVar5[lVar18] == 0) {
      iVar2 = piVar5[local_c0];
      if (iVar2 == 0) {
        lVar26 = (long)*(int *)(local_c8[1] + weight->tag) + plVar9[local_c0];
        lVar10 = plVar9[lVar18];
        if (lVar26 < lVar10) {
          __assert_fail("dist[v] + weight[*ei] >= dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xca,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        if ((lVar26 != lVar10) &&
           (local_c0 ==
            (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar18])) {
          __assert_fail("dist[v] + weight[*ei] == dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xce,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
      }
      else if (iVar2 != 1) {
        __assert_fail("label[v] == FINITE || label[v] == PLUS",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,199,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
    }
    local_c8 = local_c8 + 2;
    if (local_c8 == local_b8) {
      lVar18 = uVar23 * 0x20 + 0x28;
      do {
        if (uVar19 - 1 == uVar23) {
          uStack_e0 = uStack_d8;
          uStack_df = uStack_d7;
          uVar23 = uVar19;
          goto LAB_0011353b;
        }
        plVar11 = *(long **)(*(long *)(local_a8 + 0x18) + -8 + lVar18);
        plVar12 = *(long **)(*(long *)(local_a8 + 0x18) + lVar18);
        lVar18 = lVar18 + 0x20;
        uVar23 = uVar23 + 1;
      } while (plVar12 == plVar11);
      uStack_e0 = (undefined1)uVar23;
      uStack_df = (undefined7)(uVar23 >> 8);
      local_c8 = plVar11;
      local_b0 = uVar23;
      local_b8 = plVar12;
      local_c0 = uVar23;
    }
  } while( true );
}

Assistant:

std::vector<int> CHECK_BELLMAN_FORD(const Graph& G, const int& s, const WeightMap& weight, std::vector<unsigned long>& pred, std::vector<long>& dist)
{
    // init
    unsigned long  n_vertices = num_vertices(G);
    enum{ NEG_CYCLE = -2, ATT_TO_CYCLE = -1, FINITE = 0, PLUS = 1, CYCLE = 2, ON_CUR_PATH = 3, UNKNOWN = 4 };
    std::vector<int> label(n_vertices, UNKNOWN);
    std::vector<bool> reachable(n_vertices, false);

    dfs(G,s,reachable);
    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if (*v != s) {
            // if v in V+, their is a path s-v
            assert( (pred[*v] == *v) == (reachable[*v] == false));
            if (reachable[*v] == false) label[*v]=PLUS;
        }
    }

    // classification of nodes
    if (pred[s]==s) label[s]=FINITE;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if(label[*v]==UNKNOWN) {
            std::stack<Vertex> S;
            Vertex w = *v;
            while (label[w]==UNKNOWN) {
                label[w]=ON_CUR_PATH;
                S.push(w);
                w = pred[w];
            }
            // label all nodes on current path
            int t = label[w];
            if ( t == ON_CUR_PATH ) {
                Vertex z;
                do { 
                    z = S.top(); S.pop();
                    label[z] = CYCLE;
                } while ( z != w );

                while ( !S.empty() ) {
                    label[S.top()] = ATT_TO_CYCLE;
                    S.pop();
                }
            } else { // t is CYCLE, ATT_TO_CYCLE, or FINITE
                if ( t == CYCLE ) t = ATT_TO_CYCLE;
                while ( !S.empty() ) {
                    label[S.top()] = t;
                    S.pop();
                }
            }
        }
    }

    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
         if ( label[*v] == CYCLE ){
            Vertex w = *v;
            long cycle_length = 0;
            do { 
                cycle_length += weight[edge(pred[w], w, G).first];
                label[w] = NEG_CYCLE;
                w = pred[w];
            } while (w != *v);
            // All cycles in P have negative weight
            assert(cycle_length < 0);
         }
    }

    if ( label[s] == FINITE ) assert(dist[s] == 0);
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei){
        Vertex v = source(*ei, G);
        Vertex w = target(*ei, G);
        if ( label[w] == FINITE ) {
            // Their is no edge(v,w) where v in V- and w in Vf
            assert( label[v] == FINITE || label[v] == PLUS);
            // For each e(v,w) if v and w in Vf, dist[v] + weight[e] >= dist[w]
            if ( label[v] == FINITE ) {
                assert( dist[v] + weight[*ei] >= dist[w] );
                // For each vertex v in Vf,
                // If v=s then dist[v]=0
                // Else dist[v] = dist[u] + weight[edge(u,v)]
                if ( source(*ei, G) == pred[w] ) assert( dist[v] + weight[*ei] == dist[w] );
            }
        }
    }

    return label;
}